

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlTreeErr(int code,xmlNodePtr node,char *extra)

{
  char *local_28;
  char *msg;
  char *extra_local;
  xmlNodePtr node_local;
  int code_local;
  
  switch(code) {
  case 0x514:
    local_28 = "invalid hexadecimal character value\n";
    break;
  case 0x515:
    local_28 = "invalid decimal character value\n";
    break;
  case 0x516:
    local_28 = "unterminated entity reference %15s\n";
    break;
  case 0x517:
    local_28 = "string is not in UTF-8\n";
    break;
  default:
    local_28 = "unexpected error number\n";
  }
  __xmlSimpleError(2,code,node,local_28,extra);
  return;
}

Assistant:

static void
xmlTreeErr(int code, xmlNodePtr node, const char *extra)
{
    const char *msg = NULL;

    switch(code) {
        case XML_TREE_INVALID_HEX:
	    msg = "invalid hexadecimal character value\n";
	    break;
	case XML_TREE_INVALID_DEC:
	    msg = "invalid decimal character value\n";
	    break;
	case XML_TREE_UNTERMINATED_ENTITY:
	    msg = "unterminated entity reference %15s\n";
	    break;
	case XML_TREE_NOT_UTF8:
	    msg = "string is not in UTF-8\n";
	    break;
	default:
	    msg = "unexpected error number\n";
    }
    __xmlSimpleError(XML_FROM_TREE, code, node, msg, extra);
}